

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O2

void __thiscall CFGsContainer::checkAll(CFGsContainer *this)

{
  _Self __tmp;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    CFG::check((CFG *)p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void CFGsContainer::checkAll() {
	for (std::map<Addr, CFG*>::iterator it = m_cfgsMap.begin(),
			ed = m_cfgsMap.end(); it != ed; it++) {
		CFG* cfg = it->second;
		cfg->check();
	}
}